

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O2

_Bool SASToken_Validate(STRING_HANDLE sasToken)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  char *pcVar6;
  LOGGER_LOG p_Var7;
  time_t stopTime;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  size_t __n;
  uint uVar19;
  size_t __size;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  
  pcVar4 = STRING_c_str(sasToken);
  uVar19 = 0;
  if (pcVar4 != (char *)0x0 && sasToken != (STRING_HANDLE)0x0) {
    sVar5 = STRING_length(sasToken);
    uVar3 = (uint)sVar5;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = sVar5 & 0xffffffff;
    }
    uVar17 = 3;
    uVar18 = 0xfffffffe;
    iVar9 = -1;
    uVar10 = 0xffffffff;
    uVar15 = 0xffffffff;
    uVar21 = 0xffffffff;
    uVar14 = 0xffffffff;
    uVar12 = 0xffffffff;
    while( true ) {
      iVar11 = (int)uVar12;
      iVar13 = (int)uVar14;
      iVar20 = (int)uVar21;
      if (uVar17 - uVar16 == 3) break;
      uVar2 = uVar15;
      if (pcVar4[uVar17 - 3] == 's') {
        cVar1 = pcVar4[uVar17 - 2];
        if (cVar1 == 'r') {
          if (pcVar4[uVar17 - 1] == '=') {
            if ((iVar11 < 1) || (-1 < iVar13)) {
              if ((0 < iVar9) && ((int)uVar10 < 0)) {
                if (pcVar4[uVar17 - 4] != ' ') {
                  uVar21 = 0xffffffffffffffff;
                  if (pcVar4[uVar17 - 4] == '&') {
                    uVar21 = uVar17;
                    uVar10 = uVar18;
                  }
                  uVar21 = uVar21 & 0xffffffff;
                  goto LAB_00103bc9;
                }
                uVar10 = uVar19 - 1;
              }
            }
            else {
              if (pcVar4[uVar17 - 4] != ' ') {
                bVar22 = pcVar4[uVar17 - 4] == '&';
                uVar21 = 0xffffffff;
                if (bVar22) {
                  uVar21 = uVar17 & 0xffffffff;
                }
LAB_00103b8b:
                if (bVar22) {
                  uVar14 = (ulong)uVar18;
                }
                goto LAB_00103bc9;
              }
              uVar14 = (ulong)(uVar18 + 1);
            }
            uVar21 = uVar17 & 0xffffffff;
          }
        }
        else if (cVar1 == 'i') {
          if ((pcVar4[uVar17 - 1] == 'g') && (pcVar4[uVar17] == '=')) {
            iVar9 = uVar18 + 6;
            if ((iVar20 < 1) || (-1 < (int)uVar15)) {
              if ((0 < iVar11) && (iVar13 < 0)) {
                if (pcVar4[uVar17 - 4] != ' ') {
                  bVar22 = pcVar4[uVar17 - 4] == '&';
                  if (!bVar22) {
                    iVar9 = -1;
                  }
                  goto LAB_00103b8b;
                }
                uVar14 = (ulong)(uVar19 - 1);
              }
            }
            else if (pcVar4[uVar17 - 4] == ' ') {
              uVar2 = uVar19 - 1;
            }
            else {
              uVar2 = uVar18;
              if (pcVar4[uVar17 - 4] != '&') {
                iVar9 = -1;
                uVar2 = uVar15;
              }
            }
          }
        }
        else if ((cVar1 == 'e') && (pcVar4[uVar17 - 1] == '=')) {
          if ((iVar20 < 1) || (-1 < (int)uVar15)) {
            if ((0 < iVar9) && ((int)uVar10 < 0)) {
              if (pcVar4[uVar17 - 4] != ' ') {
                bVar22 = pcVar4[uVar17 - 4] == '&';
                if (bVar22) {
                  uVar10 = uVar18;
                }
                goto LAB_00103bc2;
              }
              uVar10 = uVar18 + 1;
            }
          }
          else {
            if (pcVar4[uVar17 - 4] != ' ') {
              bVar22 = pcVar4[uVar17 - 4] == '&';
              if (bVar22) {
                uVar15 = uVar18;
              }
LAB_00103bc2:
              uVar12 = 0xffffffff;
              uVar2 = uVar15;
              if (bVar22) {
                uVar12 = uVar17 & 0xffffffff;
              }
              goto LAB_00103bc9;
            }
            uVar15 = uVar18 + 1;
          }
          uVar12 = uVar17 & 0xffffffff;
          uVar2 = uVar15;
        }
      }
LAB_00103bc9:
      uVar15 = uVar2;
      uVar19 = uVar19 + 1;
      uVar17 = uVar17 + 1;
      uVar18 = uVar18 + 1;
    }
    uVar19 = 0;
    if (((-1 < iVar11) && (uVar19 = 0, -1 < iVar20)) && (-1 < iVar9)) {
      uVar18 = uVar10;
      if (iVar13 < 0) {
        uVar14 = sVar5 & 0xffffffff;
        uVar3 = uVar15;
      }
      else if ((-1 < (int)uVar15) && (uVar18 = uVar3, uVar3 = uVar15, -1 < (int)uVar10)) {
        uVar18 = uVar10;
      }
      uVar19 = 0;
      if (((iVar11 < (int)uVar14) && (iVar20 < (int)uVar3)) && (iVar9 < (int)uVar18)) {
        __n = (uVar14 - uVar12) + 1;
        __size = 0xffffffffffffffff;
        if (__n != 0) {
          __size = __n;
        }
        if ((__size == 0xffffffffffffffff) || (__s = (char *)malloc(__size), __s == (char *)0x0)) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 == (LOGGER_LOG)0x0) {
            uVar19 = 0;
          }
          else {
            uVar19 = 0;
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                      ,"SASToken_Validate",0xa3,1,"malloc error, size:%zu",__size);
          }
        }
        else {
          memset(__s,0,__n);
          pcVar6 = __s;
          for (; (uVar12 < uVar14 && (pcVar4[uVar12] != '&')); uVar12 = uVar12 + 1) {
            *pcVar6 = pcVar4[uVar12];
            pcVar6 = pcVar6 + 1;
          }
          dVar24 = 0.0;
          for (pcVar4 = __s; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
            bVar8 = *pcVar4 - 0x30;
            if (9 < bVar8) goto LAB_00103d27;
            dVar24 = dVar24 * 10.0 + (double)(int)(char)bVar8;
          }
          if (dVar24 <= 0.0) {
LAB_00103d27:
            uVar19 = 0;
          }
          else {
            stopTime = get_time((time_t *)0x0);
            dVar23 = get_difftime(stopTime,0);
            uVar19 = (uint)(dVar23 <= dVar24);
          }
          free(__s);
        }
      }
    }
  }
  return SUB41(uVar19,0);
}

Assistant:

bool SASToken_Validate(STRING_HANDLE sasToken)
{
    bool result;
    /*Codes_SRS_SASTOKEN_25_025: [**SASToken_Validate shall get the SASToken value by invoking STRING_c_str on the handle.**]***/
    const char* sasTokenArray = STRING_c_str(sasToken);

    /* Codes_SRS_SASTOKEN_25_024: [**If handle is NULL then SASToken_Validate shall return false.**] */
    /* Codes_SRS_SASTOKEN_25_026: [**If STRING_c_str on handle return NULL then SASToken_Validate shall return false.**] */
    if (sasToken == NULL || sasTokenArray == NULL)
    {
        result = false;
    }
    else
    {
        int seStart = -1, seStop = -1;
        int srStart = -1, srStop = -1;
        int sigStart = -1, sigStop = -1;
        int tokenLength = (int)STRING_length(sasToken);
        int i;
        for (i = 0; i < tokenLength; i++)
        {
            if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'e' && sasTokenArray[i + 2] == '=') // Look for se=
            {
                seStart = i + 3;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ') // look for either & or space
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        seStart = -1; // as the format is not either "&se=" or " se="
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        seStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'r' && sasTokenArray[i + 2] == '=') // Look for sr=
            {
                srStart = i + 3;
                if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        srStart = -1;
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        srStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'i' && sasTokenArray[i + 2] == 'g' && sasTokenArray[i + 3] == '=') // Look for sig=
            {
                sigStart = i + 4;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        sigStart = -1;
                }
                else if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        sigStart = -1;
                }
            }
        }

        /*Codes_SRS_SASTOKEN_25_027: [**If SASTOKEN does not obey the SASToken format then SASToken_Validate shall return false.**]***/
        /*Codes_SRS_SASTOKEN_25_028: [**SASToken_validate shall check for the presence of sr, se and sig from the token and return false if not found**]***/
        if (seStart < 0 || srStart < 0 || sigStart < 0)
        {
            result = false;
        }
        else
        {
            if (seStop < 0)
            {
                seStop = tokenLength;
            }
            else if (srStop < 0)
            {
                srStop = tokenLength;
            }
            else if (sigStop < 0)
            {
                sigStop = tokenLength;
            }

            if ((seStop <= seStart) ||
                (srStop <= srStart) ||
                (sigStop <= sigStart))
            {
                result = false;
            }
            else
            {
                char* expiryASCII;
                size_t malloc_size = safe_subtract_size_t((size_t)seStop, (size_t)seStart);
                malloc_size = safe_add_size_t(malloc_size, 1);
                /*Codes_SRS_SASTOKEN_25_031: [**If malloc fails during validation then SASToken_Validate shall return false.**]***/
                if (malloc_size == SIZE_MAX ||
                    (expiryASCII = (char*)malloc(malloc_size)) == NULL)
                {
                    LogError("malloc error, size:%zu", malloc_size);
                    result = false;
                }
                else
                {
                    double expiry;
                    // Add the Null terminator here
                    memset(expiryASCII, 0, (size_t)seStop - (size_t)seStart + 1);
                    for (i = seStart; i < seStop; i++)
                    {
                        // The se contains the expiration values, if a & token is encountered then
                        // the se field is complete.
                        if (sasTokenArray[i] == '&')
                        {
                            break;
                        }
                        expiryASCII[i - seStart] = sasTokenArray[i];
                    }
                    expiry = getExpiryValue(expiryASCII);
                    /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                    if (expiry <= 0)
                    {
                        result = false;
                    }
                    else
                    {
                        double secSinceEpoch = get_difftime(get_time(NULL), (time_t)0);
                        if (expiry < secSinceEpoch)
                        {
                            /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                            result = false;
                        }
                        else
                        {
                            /*Codes_SRS_SASTOKEN_25_030: [**SASToken_validate shall return true only if the format is obeyed and the token has not yet expired **]***/
                            result = true;
                        }
                    }
                    free(expiryASCII);
                }
            }
        }
    }

    return result;
}